

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateParser
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  Descriptor::name_abi_cxx11_(this->descriptor_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "public static com.google.protobuf.Parser<$classname$> PARSER =\n    new com.google.protobuf.AbstractParser<$classname$>() {\n"
             ,(string *)"classname");
  google::protobuf::io::Printer::Indent();
  Descriptor::name_abi_cxx11_(this->descriptor_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "public $classname$ parsePartialFrom(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
             ,(string *)"classname");
  bVar1 = HasGeneratedMethods(this->descriptor_);
  if (bVar1) {
    Descriptor::name_abi_cxx11_(this->descriptor_);
    google::protobuf::io::Printer::Print
              ((char *)printer,"  return new $classname$(input, extensionRegistry);\n",
               (string *)"classname");
  }
  else {
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Print((char *)printer);
    google::protobuf::io::Printer::Outdent();
  }
  google::protobuf::io::Printer::Print((char *)printer);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  Descriptor::name_abi_cxx11_(this->descriptor_);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "@java.lang.Override\npublic com.google.protobuf.Parser<$classname$> getParserForType() {\n  return PARSER;\n}\n\n"
             ,(string *)"classname");
  return;
}

Assistant:

void MessageGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Parser<$classname$> PARSER =\n"
      "    new com.google.protobuf.AbstractParser<$classname$>() {\n",
      "classname", descriptor_->name());
  printer->Indent();
  printer->Print(
      "public $classname$ parsePartialFrom(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  if (HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "  return new $classname$(input, extensionRegistry);\n",
        "classname", descriptor_->name());
  } else {
    // When parsing constructor isn't generated, use builder to parse messages.
    // Note, will fallback to use reflection based mergeFieldFrom() in
    // AbstractMessage.Builder.
    printer->Indent();
    printer->Print(
        "Builder builder = newBuilder();\n"
        "try {\n"
        "  builder.mergeFrom(input, extensionRegistry);\n"
        "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
        "  throw e.setUnfinishedMessage(builder.buildPartial());\n"
        "} catch (java.io.IOException e) {\n"
        "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
        "      e.getMessage()).setUnfinishedMessage(builder.buildPartial());\n"
        "}\n"
        "return builder.buildPartial();\n");
    printer->Outdent();
  }
  printer->Print(
        "}\n");
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public com.google.protobuf.Parser<$classname$> getParserForType() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());
}